

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockSingleNestedStructArrayCase::init
          (BlockSingleNestedStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_> *this_00;
  ShaderInterface *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  deUint32 extraout_EAX;
  deUint32 dVar2;
  StructType *this_02;
  StructType *this_03;
  BufferBlock *this_04;
  VarType local_a0;
  BufferVar local_88;
  VarType local_48;
  
  this_01 = &(this->super_SSBOLayoutCase).m_interface;
  this_02 = bb::ShaderInterface::allocStruct(this_01,"S");
  glu::VarType::VarType((VarType *)&local_88,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"a",(VarType *)&local_88);
  glu::VarType::~VarType((VarType *)&local_88);
  glu::VarType::VarType(&local_a0,TYPE_INT_VEC2,PRECISION_MEDIUMP);
  glu::VarType::VarType((VarType *)&local_88,&local_a0,4);
  glu::StructType::addMember(this_02,"b",(VarType *)&local_88);
  glu::VarType::~VarType((VarType *)&local_88);
  glu::VarType::~VarType(&local_a0);
  glu::VarType::VarType((VarType *)&local_88,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"c",(VarType *)&local_88);
  glu::VarType::~VarType((VarType *)&local_88);
  this_03 = bb::ShaderInterface::allocStruct(this_01,"T");
  glu::VarType::VarType((VarType *)&local_88,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  glu::StructType::addMember(this_03,"a",(VarType *)&local_88);
  glu::VarType::~VarType((VarType *)&local_88);
  glu::VarType::VarType(&local_a0,this_02);
  glu::VarType::VarType((VarType *)&local_88,&local_a0,3);
  glu::StructType::addMember(this_03,"b",(VarType *)&local_88);
  glu::VarType::~VarType((VarType *)&local_88);
  glu::VarType::~VarType(&local_a0);
  this_04 = bb::ShaderInterface::allocBlock(this_01,"Block");
  glu::VarType::VarType(&local_a0,this_02);
  bb::BufferVar::BufferVar(&local_88,"s",&local_a0,0x1000);
  this_00 = &this_04->m_variables;
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,&local_88);
  glu::VarType::~VarType(&local_88.m_type);
  paVar1 = &local_88.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_name._M_dataplus._M_p,
                    local_88.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_a0);
  glu::VarType::VarType(&local_a0,TYPE_FLOAT_VEC2,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_88,"v",&local_a0,0);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,&local_88);
  glu::VarType::~VarType(&local_88.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_name._M_dataplus._M_p,
                    local_88.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_a0);
  glu::VarType::VarType(&local_48,this_03);
  glu::VarType::VarType(&local_a0,&local_48,2);
  bb::BufferVar::BufferVar(&local_88,"t",&local_a0,0x800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,&local_88);
  glu::VarType::~VarType(&local_88.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_name._M_dataplus._M_p,
                    local_88.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_a0);
  glu::VarType::~VarType(&local_48);
  glu::VarType::VarType(&local_a0,TYPE_UINT,PRECISION_HIGHP);
  bb::BufferVar::BufferVar(&local_88,"u",&local_a0,0x1800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,&local_88);
  glu::VarType::~VarType(&local_88.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_name._M_dataplus._M_p,
                    local_88.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_a0);
  dVar2 = this->m_layoutFlags;
  this_04->m_flags = dVar2;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::_M_replace
              ((ulong)&this_04->m_instanceName,0,(char *)(this_04->m_instanceName)._M_string_length,
               0x1c7d87e);
    bb::BufferBlock::setArraySize(this_04,this->m_numInstances);
    dVar2 = extraout_EAX;
  }
  return dVar2;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP));
		typeT.addMember("b", VarType(VarType(&typeS), 3));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("s", VarType(&typeS), ACCESS_WRITE));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("t", VarType(VarType(&typeT), 2), ACCESS_READ));
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}